

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

bool __thiscall ExecutorX86::Run(ExecutorX86 *this,uint functionID,char *arguments)

{
  RegVmRegister **ppRVar1;
  CodeGenRegVmStateContext *__env;
  uint uVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar3;
  RegVmRegister RVar4;
  uint *puVar5;
  uchar *puVar6;
  CodeGenRegVmCallStackEntry *pCVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ExternFuncInfo *pEVar12;
  RegVmRegister *pRVar13;
  uchar **ppuVar14;
  size_t sVar15;
  ExternTypeInfo *pEVar16;
  ExternMemberInfo *pEVar17;
  byte bVar18;
  char *pcVar19;
  uint uVar20;
  sigaction sigSEGV;
  sigaction sigTRAP;
  sigaction sigFPE;
  sigaction sa;
  jmp_buf prevErrorHandler;
  JmpBufData data;
  
  if (this->exRegVmCode->count == 0) {
    pcVar19 = "ERROR: module contains no code";
LAB_0013f69e:
    Stop(this,pcVar19);
    return false;
  }
  bVar18 = functionID != 0xffffffff & this->codeRunning;
  if ((bVar18 == 0) && (bVar8 = InitExecution(this), !bVar8)) {
    return false;
  }
  this->codeRunning = true;
  uVar2 = this->lastFinalReturn;
  this->lastFinalReturn =
       (uint)((ulong)((long)(this->vmState).callStackTop - (long)(this->vmState).callStackBase) >> 2
             );
  pcVar19 = (this->vmState).dataStackBase;
  uVar11 = (long)(this->vmState).dataStackTop - (long)pcVar19;
  if ((uVar11 & 0xf) != 0) {
    __assert_fail("prevDataSize % 16 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x35d,"bool ExecutorX86::Run(unsigned int, const char *)");
  }
  paVar3 = &((this->vmState).regFileLastTop)->field_0;
  if (functionID == 0xffffffff) {
    uVar20 = this->exLinker->globalVarSize;
    if ((uint)uVar11 < uVar20) {
      __assert_fail("unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x3c1,"bool ExecutorX86::Run(unsigned int, const char *)");
    }
    uVar9 = 0;
    NULLC::fillMemory(pcVar19,0,(ulong)uVar20);
    *paVar3 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
    paVar3[1] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
    paVar3[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->exLinker->exRegVmConstants).data
    ;
    paVar3[3].longValue = (int64_t)paVar3;
    NULLC::fillMemory(paVar3 + 4,0,0x7e0);
    pRVar13 = (this->vmState).regFileLastPtr;
    (this->vmState).regFileLastPtr = (RegVmRegister *)paVar3;
    ppRVar1 = &(this->vmState).regFileLastTop;
    *ppRVar1 = *ppRVar1 + 0x100;
    uVar20 = 0;
LAB_0013f727:
    (this->vmState).jitCodeActive = true;
    if (bVar18 == 0) {
      sa.__sigaction_handler.sa_handler = NULLC::HandleError;
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = 0x10000004;
      sigaction(8,(sigaction *)&sa,(sigaction *)&sigFPE);
      sigaction(5,(sigaction *)&sa,(sigaction *)&sigTRAP);
      sigaction(0xb,(sigaction *)&sa,(sigaction *)&sigSEGV);
    }
    NULLC::copyMemory(&data,NULLC::errorHandler,200);
    iVar10 = __sigsetjmp(NULLC::errorHandler,1);
    if (iVar10 == 0) {
      __env = &this->vmState;
      ppuVar14 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,uVar20);
      puVar6 = *ppuVar14;
      NULLC::copyMemory(prevErrorHandler,__env,200);
      iVar10 = _setjmp((__jmp_buf_tag *)__env);
      if (iVar10 == 0) {
        uVar20 = (*(code *)this->codeLaunchHeader)(puVar6,paVar3);
      }
      else {
        uVar20 = 5;
      }
      NULLC::copyMemory(__env,prevErrorHandler,200);
    }
    else {
      uVar20 = 5;
    }
    if (this->lastFinalReturn == 0) {
      sigaction(8,(sigaction *)&sigFPE,(sigaction *)0x0);
      sigaction(5,(sigaction *)&sigTRAP,(sigaction *)0x0);
      sigaction(0xb,(sigaction *)&sigSEGV,(sigaction *)0x0);
    }
    NULLC::copyMemory(NULLC::errorHandler,&data,200);
    (this->vmState).jitCodeActive = false;
    (this->vmState).regFileLastPtr = pRVar13;
    if (functionID == 0xffffffff) {
      ppRVar1 = &(this->vmState).regFileLastTop;
      *ppRVar1 = *ppRVar1 + -0x100;
    }
    bVar18 = 0;
  }
  else {
    pEVar12 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionID);
    uVar20 = pEVar12->regVmAddress;
    uVar9 = GetFunctionVmReturnType(pEVar12,this->exTypes->data,(this->exLinker->exTypeExtra).data);
    if (uVar20 == 0xffffffff) {
      if (pEVar12->retType == '\0') {
        pcVar19 = "ERROR: can\'t call external function with complex return type";
        goto LAB_0013f69e;
      }
      NULLC::copyMemory((this->vmState).tempStackArrayBase,arguments,(ulong)pEVar12->argumentSize);
      uVar20 = uVar9;
      if (pEVar12->funcPtrWrap == (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
        Stop(this,"ERROR: external raw function calls are disabled");
        bVar18 = 1;
      }
      else {
        puVar5 = (this->vmState).tempStackArrayBase;
        (*pEVar12->funcPtrWrap)(pEVar12->funcPtrWrapTarget,(char *)puVar5,(char *)puVar5);
        bVar18 = this->callContinue ^ 1;
      }
      goto LAB_0013f981;
    }
    pcVar19 = (this->vmState).dataStackTop;
    iVar10 = *(int *)&(this->vmState).dataStackBase;
    if (((int)pcVar19 - iVar10) + pEVar12->argumentSize <
        (uint)(*(int *)&(this->vmState).dataStackEnd - iVar10)) {
      NULLC::copyMemory(pcVar19,arguments,(ulong)pEVar12->argumentSize);
      RVar4.field_0 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->vmState).dataStackBase;
      iVar10 = RVar4.field_0.intValue;
      if ((*(int *)&(this->vmState).dataStackTop - iVar10) + (pEVar12->stackSize + 0xf & 0xfffffff0)
          < (uint)(*(int *)&(this->vmState).dataStackEnd - iVar10)) {
        *paVar3 = RVar4.field_0;
        paVar3[1].longValue = (int64_t)((this->vmState).dataStackBase + (uVar11 & 0xffffffff));
        paVar3[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)
                    (this->exLinker->exRegVmConstants).data;
        paVar3[3].longValue = (int64_t)paVar3;
        pRVar13 = (this->vmState).regFileLastPtr;
        (this->vmState).regFileLastPtr = (RegVmRegister *)paVar3;
        goto LAB_0013f727;
      }
    }
    pCVar7 = (this->vmState).callStackTop;
    pCVar7->instruction = uVar20 + 1;
    (this->vmState).callStackTop = pCVar7 + 1;
    Stop(this,"ERROR: stack overflow");
    uVar9 = 5;
    bVar18 = 0;
    uVar20 = uVar9;
  }
LAB_0013f981:
  (this->vmState).dataStackTop = (this->vmState).dataStackBase + (uVar11 & 0xffffffff);
  if (uVar20 != 5) {
    if ((uVar9 != 0) && (uVar9 != uVar20)) {
      __assert_fail("retType == resultType && \"expected different result\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x43f,"bool ExecutorX86::Run(unsigned int, const char *)");
    }
    if (bVar18 == 0) {
      if (this->lastFinalReturn == 0) {
        this->codeRunning = false;
      }
      this->lastFinalReturn = uVar2;
      if (functionID == 0xffffffff) {
        (this->vmState).tempStackType = 0;
        if (uVar20 == 1) {
          (this->vmState).tempStackType = 7;
        }
        else if (uVar20 == 2) {
          (this->vmState).tempStackType = 5;
        }
        else if (uVar20 == 3) {
          (this->vmState).tempStackType = 4;
        }
        return true;
      }
      pEVar12 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,functionID);
      pEVar16 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                          (this->exTypes,pEVar12->funcType);
      pEVar17 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                          (&this->exLinker->exTypeExtra,(pEVar16->field_11).subType);
      (this->vmState).tempStackType = pEVar17->type;
      return true;
    }
  }
  uVar20 = this->lastFinalReturn;
  if (uVar20 == 0) {
    pcVar19 = this->execErrorBuffer;
    sVar15 = strlen(pcVar19);
    pcVar19 = pcVar19 + sVar15;
    iVar10 = NULLC::SafeSprintf(pcVar19,(long)(0x10000 - (int)sVar15),"\r\nCall stack:\r\n");
    pcVar19 = pcVar19 + iVar10;
    uVar20 = 0;
    while ((pCVar7 = (this->vmState).callStackBase,
           uVar20 < (uint)((ulong)((long)(this->vmState).callStackTop - (long)pCVar7) >> 2) &&
           (uVar9 = pCVar7[uVar20].instruction, uVar9 != 0))) {
      uVar9 = PrintStackFrame(uVar9,pcVar19,
                              (*(int *)&this->execErrorBuffer - (int)pcVar19) + 0x10000,false);
      pcVar19 = pcVar19 + uVar9;
      uVar20 = uVar20 + 1;
    }
    uVar20 = this->lastFinalReturn;
  }
  this->execErrorFinalReturnDepth = uVar20;
  this->lastFinalReturn = uVar2;
  this->callContinue = false;
  this->codeRunning = false;
  return false;
}

Assistant:

bool ExecutorX86::Run(unsigned int functionID, const char *arguments)
{
	if(exRegVmCode.empty())
	{
		Stop("ERROR: module contains no code");
		return false;
	}

	bool firstRun = !codeRunning || functionID == ~0u;

	if(firstRun)
	{
		if(!InitExecution())
			return false;
	}

	codeRunning = true;

	RegVmReturnType retType = rvrVoid;

	unsigned instructionPos = 0;

	bool errorState = false;

	// We will know that return is global if call stack size is equal to current
	unsigned prevLastFinalReturn = lastFinalReturn;
	lastFinalReturn = unsigned(vmState.callStackTop - vmState.callStackBase);

	unsigned prevDataSize = unsigned(vmState.dataStackTop - vmState.dataStackBase);

	assert(prevDataSize % 16 == 0);

	RegVmRegister *regFilePtr = vmState.regFileLastTop;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];

		unsigned funcPos = ~0u;
		funcPos = target.regVmAddress;

		retType = (RegVmReturnType)GetFunctionVmReturnType(target, exTypes.data, exLinker->exTypeExtra.data);

		if(funcPos == ~0u)
		{
			// Can't return complex types here
			if(target.retType == ExternFuncInfo::RETURN_UNKNOWN)
			{
				Stop("ERROR: can't call external function with complex return type");
				return false;
			}

			// Copy all arguments
			NULLC::copyMemory(vmState.tempStackArrayBase, arguments, target.argumentSize);

			// Call function
			if(target.funcPtrWrap)
			{
				target.funcPtrWrap(target.funcPtrWrapTarget, (char*)vmState.tempStackArrayBase, (char*)vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
			}
			else
			{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
				RunRawExternalFunction(dcCallVM, exFunctions[functionID], exLinker->exLocals.data, exTypes.data, exLinker->exTypeExtra.data, vmState.tempStackArrayBase, vmState.tempStackArrayBase);

				if(!callContinue)
					errorState = true;
#else
				Stop("ERROR: external raw function calls are disabled");

				errorState = true;
#endif
			}

			// This will disable NULLC code execution while leaving error check and result retrieval
			instructionPos = ~0u;
		}
		else
		{
			instructionPos = funcPos;

			unsigned argumentsSize = target.argumentSize;

			if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + argumentsSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
			{
				CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

				entry->instruction = instructionPos + 1;

				vmState.callStackTop++;

				instructionPos = ~0u;
				Stop("ERROR: stack overflow");
				retType = rvrError;
			}
			else
			{
				// Copy arguments to new stack frame
				NULLC::copyMemory(vmState.dataStackTop, arguments, argumentsSize);

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

				if(unsigned(vmState.dataStackTop - vmState.dataStackBase) + stackSize >= unsigned(vmState.dataStackEnd - vmState.dataStackBase))
				{
					CodeGenRegVmCallStackEntry *entry = vmState.callStackTop;

					entry->instruction = instructionPos + 1;

					vmState.callStackTop++;

					instructionPos = ~0u;
					Stop("ERROR: stack overflow");
					retType = rvrError;
				}
				else
				{
					regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
					regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase + prevDataSize);
					regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
					regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);
				}
			}
		}
	}
	else
	{
		// If global code is executed, reset all global variables
		assert(unsigned(vmState.dataStackTop - vmState.dataStackBase) >= exLinker->globalVarSize);
		NULLC::fillMemory(vmState.dataStackBase, 0, exLinker->globalVarSize);

		regFilePtr[rvrrGlobals].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrFrame].ptrValue = uintptr_t(vmState.dataStackBase);
		regFilePtr[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
		regFilePtr[rvrrRegisters].ptrValue = uintptr_t(regFilePtr);

		NULLC::fillMemory(regFilePtr + rvrrCount, 0, (256 - rvrrCount) * sizeof(regFilePtr[0]));
	}

	RegVmRegister *prevRegFilePtr = vmState.regFileLastPtr;

	vmState.regFileLastPtr = regFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop += 256;

	RegVmReturnType resultType = retType;

	if(instructionPos != ~0u)
	{
		vmState.jitCodeActive = true;

#ifdef __linux
		struct sigaction sa;
		struct sigaction sigFPE;
		struct sigaction sigTRAP;
		struct sigaction sigSEGV;

		if(firstRun)
		{
			sa.sa_sigaction = NULLC::HandleError;
			sigemptyset(&sa.sa_mask);
			sa.sa_flags = SA_RESTART | SA_SIGINFO;

			sigaction(SIGFPE, &sa, &sigFPE);
			sigaction(SIGTRAP, &sa, &sigTRAP);
			sigaction(SIGSEGV, &sa, &sigSEGV);
		}

		int errorCode = 0;

		NULLC::JmpBufData data;
		NULLC::copyMemory(data.data, NULLC::errorHandler, sizeof(sigjmp_buf));

		if(!(errorCode = sigsetjmp(NULLC::errorHandler, 1)))
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		else
		{
			resultType = rvrError;
		}

		// Disable signal handlers only from top-level Run
		if(lastFinalReturn == 0)
		{
			sigaction(SIGFPE, &sigFPE, NULL);
			sigaction(SIGTRAP, &sigTRAP, NULL);
			sigaction(SIGSEGV, &sigSEGV, NULL);
		}

		NULLC::copyMemory(NULLC::errorHandler, data.data, sizeof(sigjmp_buf));
#else
		__try
		{
			unsigned char *codeStart = instAddress[instructionPos];

			jmp_buf prevErrorHandler;
			NULLC::copyMemory(&prevErrorHandler, &vmState.errorHandler, sizeof(jmp_buf));

			if(!setjmp(vmState.errorHandler))
			{
				typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, RegVmRegister *regFilePtr);
				nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
				resultType = (RegVmReturnType)gate(codeStart, regFilePtr);
			}
			else
			{
				resultType = rvrError;
			}

			NULLC::copyMemory(&vmState.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		}
		__except(NULLC::CanWeHandleSEH(GetExceptionCode(), GetExceptionInformation()))
		{
			resultType = rvrError;
		}
#endif

		vmState.jitCodeActive = false;
	}

	vmState.regFileLastPtr = prevRegFilePtr;

	if(functionID == ~0u)
		vmState.regFileLastTop -= 256;

	vmState.dataStackTop = vmState.dataStackBase + prevDataSize;

	if(resultType == rvrError)
	{
		errorState = true;
	}
	else
	{
		if(retType == rvrVoid)
			retType = resultType;
		else
			assert(retType == resultType && "expected different result");
	}

	// If there was an execution error
	if(errorState)
	{
		// Print call stack on error, when we get to the first function
		if(lastFinalReturn == 0)
		{
			char *currPos = execErrorBuffer + strlen(execErrorBuffer);
			currPos += NULLC::SafeSprintf(currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), "\r\nCall stack:\r\n");

			unsigned currentFrame = 0;
			while(unsigned address = GetCallStackAddress(currentFrame++))
				currPos += PrintStackFrame(address, currPos, NULLC_ERROR_BUFFER_SIZE - int(currPos - execErrorBuffer), false);
		}

		execErrorFinalReturnDepth = lastFinalReturn;
		lastFinalReturn = prevLastFinalReturn;

		// Ascertain that execution stops when there is a chain of nullcRunFunction
		callContinue = false;
		codeRunning = false;

		return false;
	}

	if(lastFinalReturn == 0)
		codeRunning = false;

	lastFinalReturn = prevLastFinalReturn;

	if(functionID != ~0u)
	{
		ExternFuncInfo &target = exFunctions[functionID];
		ExternTypeInfo &targetType = exTypes[target.funcType];

		vmState.tempStackType = exLinker->exTypeExtra[targetType.memberOffset].type;
	}
	else
	{
		vmState.tempStackType = NULLC_TYPE_VOID;

		switch(retType)
		{
		case rvrInt:
			vmState.tempStackType = NULLC_TYPE_INT;
			break;
		case rvrDouble:
			vmState.tempStackType = NULLC_TYPE_DOUBLE;
			break;
		case rvrLong:
			vmState.tempStackType = NULLC_TYPE_LONG;
			break;
		default:
			break;
		}
	}

	return true;
}